

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utMaterialSystem.cpp
# Opt level: O0

void __thiscall
MaterialSystemTest_testMaterialNameAccess_Test::TestBody
          (MaterialSystemTest_testMaterialNameAccess_Test *this)

{
  aiString *__return_storage_ptr__;
  bool bVar1;
  aiMaterial *paVar2;
  char *pcVar3;
  AssertHelper local_480;
  Message local_478;
  int local_46c;
  undefined1 local_468 [8];
  AssertionResult gtest_ar_1;
  int retValue;
  aiString name;
  Message local_48;
  void *local_40;
  undefined1 local_38 [8];
  AssertionResult gtest_ar;
  aiMaterial *local_18;
  aiMaterial *mat;
  MaterialSystemTest_testMaterialNameAccess_Test *this_local;
  
  mat = (aiMaterial *)this;
  paVar2 = (aiMaterial *)operator_new(0x10);
  aiMaterial::aiMaterial(paVar2);
  local_40 = (void *)0x0;
  local_18 = paVar2;
  testing::internal::CmpHelperNE<decltype(nullptr),aiMaterial*>
            ((internal *)local_38,"nullptr","mat",&local_40,&local_18);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    testing::Message::Message(&local_48);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_38);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)(name.data + 0x3f8),kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utMaterialSystem.cpp"
               ,0x87,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)(name.data + 0x3f8),&local_48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(name.data + 0x3f8));
    testing::Message::~Message(&local_48);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  __return_storage_ptr__ = (aiString *)((long)&gtest_ar_1.message_.ptr_ + 4);
  aiMaterial::GetName(__return_storage_ptr__,local_18);
  pcVar3 = aiString::C_Str(__return_storage_ptr__);
  gtest_ar_1.message_.ptr_._0_4_ =
       strncmp(pcVar3,"DefaultMaterial",(ulong)gtest_ar_1.message_.ptr_._4_4_);
  local_46c = 0;
  testing::internal::EqHelper<true>::Compare<int,int>
            ((char *)local_468,"0",(int *)"retValue",&local_46c,&gtest_ar_1.message_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_468);
  if (!bVar1) {
    testing::Message::Message(&local_478);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_468);
    testing::internal::AssertHelper::AssertHelper
              (&local_480,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utMaterialSystem.cpp"
               ,0x8b,pcVar3);
    testing::internal::AssertHelper::operator=(&local_480,&local_478);
    testing::internal::AssertHelper::~AssertHelper(&local_480);
    testing::Message::~Message(&local_478);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_468);
  paVar2 = local_18;
  if (local_18 != (aiMaterial *)0x0) {
    aiMaterial::~aiMaterial(local_18);
    operator_delete(paVar2);
  }
  return;
}

Assistant:

TEST_F(MaterialSystemTest, testMaterialNameAccess) {
    aiMaterial *mat = new aiMaterial();
    EXPECT_NE(nullptr, mat);

    aiString name = mat->GetName();
    const int retValue(strncmp(name.C_Str(), AI_DEFAULT_MATERIAL_NAME, name.length));
    EXPECT_EQ(0, retValue );

    delete mat;
}